

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

int __thiscall
embree::TutorialBenchmark::main(TutorialBenchmark *this,int argc,char **argv,string *name)

{
  string *str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string benchmark_name;
  CommandLine commandLine;
  string local_80;
  CommandLine local_60 [2];
  vector<char_*,_std::allocator<char_*>_> local_50;
  int local_34;
  
  local_34 = argc;
  CommandLineParser::parseCommandLine(&this->commandLineParser,argc,argv);
  updateCommandLine(this,&local_34,argv);
  CommandLine::CommandLine
            ((CommandLine *)
             &local_50.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_34,argv);
  local_34 = (int)((ulong)((long)local_50.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage[1] -
                          (long)*local_50.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage) >> 3);
  CommandLine::CommandLine
            (local_60,local_34,
             (char **)*local_50.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  local_50.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_60[0].cl;
  (**this->_vptr_TutorialBenchmark)(this);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_60[0].cl = &local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar2,pcVar2 + name->_M_string_length);
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,".xml","");
  str = &this->inputFile;
  bVar3 = endsWith(str,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if (bVar3) {
    getFileName(&local_80,str);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,".ecs","");
    bVar3 = endsWith(str,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (!bVar3) goto LAB_0024b8b1;
    getFileName(&local_80,str);
  }
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
LAB_0024b8b1:
  iVar4 = std::__cxx11::string::compare((char *)&(this->params).name);
  if (iVar4 != 0) {
    std::__cxx11::string::_M_assign((string *)local_60);
  }
  (*this->_vptr_TutorialBenchmark[1])
            (this,local_60,
             (ulong)((long)(((_Vector_base<char_*,_std::allocator<char_*>_> *)
                            local_50.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage)->_M_impl).
                           super__Vector_impl_data._M_finish -
                    (long)(((_Vector_base<char_*,_std::allocator<char_*>_> *)
                           local_50.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage)->_M_impl).
                          super__Vector_impl_data._M_start) >> 3);
  if (local_60[0].cl != &local_50) {
    operator_delete(local_60[0].cl);
  }
  return 0;
}

Assistant:

int TutorialBenchmark::main(int argc, char** argv, std::string name)
{
  commandLineParser.parseCommandLine(argc, argv);
  updateCommandLine(argc, argv);

  CommandLine commandLine(argc, argv);

#if USE_GOOGLE_BENCHMARK
  if (!params.legacy && params.minTimeOrIterations > 0)
    commandLine.add({"--benchmark_min_time=" + std::to_string(params.minTimeOrIterations)});
  if (!params.legacy && params.repetitions > 0)
    commandLine.add({"--benchmark_repetitions=" + std::to_string(params.repetitions)});
#endif

  argc = commandLine.argc();
  argv = commandLine.argv();

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::Initialize(&argc, argv);
#endif

  commandLine = CommandLine(argc, argv);

  postParseCommandLine();

  std::string benchmark_name = name;
  if (endsWith(inputFile, ".xml")) {
    benchmark_name = getFileName(inputFile);
  }
  else if (endsWith(inputFile, ".ecs")) {
    benchmark_name = getFileName(inputFile);
  }

  if (params.name != "")
    benchmark_name = params.name;

  registerBenchmark(benchmark_name, commandLine.argc(), commandLine.argv());

#ifdef USE_GOOGLE_BENCHMARK
  if (!params.legacy)
    ::benchmark::RunSpecifiedBenchmarks();
#endif

  return 0;
}